

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall Config::Config(Config *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  char *__s1;
  int iVar2;
  mapped_type *pmVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  int option_index;
  char local_295;
  int local_294;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  long local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  key_type local_270;
  key_type local_250;
  key_type local_230;
  key_type local_210;
  key_type local_1f0;
  key_type local_1d0;
  key_type local_1b0;
  key_type local_190;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  p_Var1 = &(this->config_)._M_t._M_impl.super__Rb_tree_header;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->config_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_294 = 0;
LAB_0011050c:
  do {
    iVar2 = getopt_long(argc,argv,"p:l:s:b:",Config::long_options,&local_294);
    if (iVar2 < 0x6c) {
      if (iVar2 != 1) {
        if (iVar2 == 0x62) {
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"local_address","");
          std::__cxx11::string::string((string *)local_f0,_optarg,(allocator *)&local_290);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->config_,&local_270);
          std::__cxx11::string::_M_assign((string *)pmVar3);
          if (local_f0[0] != local_e0) {
            operator_delete(local_f0[0]);
          }
          paVar4 = &local_270.field_2;
          _Var5._M_p = local_270._M_dataplus._M_p;
        }
        else {
          if (iVar2 == -1) {
            return;
          }
LAB_00110871:
          Log::GetInstance();
          Log::FormatTime_abi_cxx11_();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_290->_M_local_buf,local_288);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," [warning] ",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"unknown option <",0x10);
          local_295 = (char)iVar2;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_295,1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">",1);
          paVar4 = &local_280;
          _Var5._M_p = (pointer)local_290;
        }
        goto LAB_00110b46;
      }
      __s1 = Config::long_options[local_294].name;
      iVar2 = strcmp(__s1,"server-port");
      if (iVar2 == 0) {
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"server_port","");
        std::__cxx11::string::string((string *)local_110,_optarg,(allocator *)&local_290);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->config_,&local_190);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        if (local_110[0] != local_100) {
          operator_delete(local_110[0]);
        }
        paVar4 = &local_190.field_2;
        _Var5._M_p = local_190._M_dataplus._M_p;
        goto LAB_00110b46;
      }
      iVar2 = strcmp(__s1,"local-port");
      if (iVar2 == 0) {
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"local_port","");
        std::__cxx11::string::string((string *)local_130,_optarg,(allocator *)&local_290);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->config_,&local_1b0);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        if (local_130[0] != local_120) {
          operator_delete(local_130[0]);
        }
        paVar4 = &local_1b0.field_2;
        _Var5._M_p = local_1b0._M_dataplus._M_p;
        goto LAB_00110b46;
      }
      iVar2 = strcmp(__s1,"server-address");
      if (iVar2 == 0) {
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"server_address","");
        std::__cxx11::string::string((string *)local_150,_optarg,(allocator *)&local_290);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->config_,&local_1d0);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        if (local_150[0] != local_140) {
          operator_delete(local_150[0]);
        }
        paVar4 = &local_1d0.field_2;
        _Var5._M_p = local_1d0._M_dataplus._M_p;
        goto LAB_00110b46;
      }
      iVar2 = strcmp(__s1,"local-address");
      if (iVar2 == 0) {
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"local_address","");
        std::__cxx11::string::string((string *)local_170,_optarg,(allocator *)&local_290);
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->config_,&local_1f0);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        if (local_170[0] != local_160) {
          operator_delete(local_170[0]);
        }
        paVar4 = &local_1f0.field_2;
        _Var5._M_p = local_1f0._M_dataplus._M_p;
        goto LAB_00110b46;
      }
      iVar2 = strcmp(__s1,"server");
      if (iVar2 != 0) goto code_r0x00110805;
      paVar4 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"is_local","");
      SetInt(this,&local_50,0);
      _Var5._M_p = local_50._M_dataplus._M_p;
      goto LAB_00110b9c;
    }
    if (iVar2 == 0x6c) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"local_port","");
      std::__cxx11::string::string((string *)local_b0,_optarg,(allocator *)&local_290);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->config_,&local_230);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0]);
      }
      paVar4 = &local_230.field_2;
      _Var5._M_p = local_230._M_dataplus._M_p;
    }
    else if (iVar2 == 0x73) {
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"server_address","");
      std::__cxx11::string::string((string *)local_d0,_optarg,(allocator *)&local_290);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->config_,&local_250);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0]);
      }
      paVar4 = &local_250.field_2;
      _Var5._M_p = local_250._M_dataplus._M_p;
    }
    else {
      if (iVar2 != 0x70) goto LAB_00110871;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"server_port","");
      std::__cxx11::string::string((string *)local_90,_optarg,(allocator *)&local_290);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->config_,&local_210);
      std::__cxx11::string::_M_assign((string *)pmVar3);
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      paVar4 = &local_210.field_2;
      _Var5._M_p = local_210._M_dataplus._M_p;
    }
LAB_00110b46:
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var5._M_p == paVar4);
  goto LAB_00110b4f;
code_r0x00110805:
  iVar2 = strcmp(__s1,"client");
  if (iVar2 == 0) {
    paVar4 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"is_local","");
    SetInt(this,&local_70,1);
    _Var5._M_p = local_70._M_dataplus._M_p;
LAB_00110b9c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar4) {
LAB_00110b4f:
      operator_delete(_Var5._M_p);
    }
  }
  goto LAB_0011050c;
}

Assistant:

Config::Config(int argc, char *argv[])
{
    int opt;
    static struct option long_options[] =
    {
        { "server-port", required_argument,    0, 1 },
        { "local-port", required_argument,    0, 1 },
        { "server-address", required_argument,    0, 1 },
        { "local-address", required_argument,    0, 1 },
        { "server", no_argument,    0, 1 },
        { "client", no_argument,    0, 1 },
        { NULL, 0, 0, 0 }
    };
    int option_index = 0;

    while ((opt = getopt_long(argc, argv, "p:l:s:b:", long_options, &option_index)) != -1)
    {
        switch (opt)
        {
        case 'p':
            this->SetStr("server_port", optarg);
            break;
        case 'l':
            this->SetStr("local_port", optarg);
            break;
        case 's':
            this->SetStr("server_address", optarg);
            break;
        case 'b':
            this->SetStr("local_address", optarg);
            break;
        case 1:
            if (strcmp(long_options[option_index].name, "server-port") == 0)
            {
                this->SetStr("server_port", optarg);
            }
            else if (strcmp(long_options[option_index].name, "local-port") == 0)
            {
                this->SetStr("local_port", optarg);
            }
            else if (strcmp(long_options[option_index].name, "server-address") == 0)
            {
                this->SetStr("server_address", optarg);
            }
            else if (strcmp(long_options[option_index].name, "local-address") == 0)
            {
                this->SetStr("local_address", optarg);
            }
            else if (strcmp(long_options[option_index].name, "server") == 0)
            {
                this->SetInt("is_local", 0);
            }
            else if (strcmp(long_options[option_index].name, "client") == 0)
            {
                this->SetInt("is_local", 1);
            }
            break;
        default:
            LOGW << "unknown option <" << (char)opt << ">";
        }
    }
}